

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O1

Vec_Ptr_t * Llb_ManFlow(Aig_Man_t *p,Vec_Ptr_t *vSources,int *pnFlow)

{
  void *pvVar1;
  int iVar2;
  Vec_Ptr_t *vMinCut;
  int iVar3;
  Aig_Obj_t *pAVar4;
  long lVar5;
  
  Aig_ManCleanData(p);
  Aig_ManIncrementTravId(p);
  if (vSources->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar5 = 0;
    iVar3 = 0;
    do {
      pvVar1 = vSources->pArray[lVar5];
      if ((*(uint *)((long)pvVar1 + 0x18) & 0x30) != 0x20) {
        __assert_fail("!pObj->fMarkA && pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x305,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
      }
      pAVar4 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
      if ((pAVar4->field_0x18 & 0x20) == 0) {
        iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar4);
        iVar3 = iVar3 + iVar2;
        if (iVar2 != 0) {
          Aig_ManIncrementTravId(p);
        }
      }
      if ((0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7) &&
         (pAVar4 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),
         (pAVar4->field_0x18 & 0x20) == 0)) {
        iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar4);
        iVar3 = iVar3 + iVar2;
        if (iVar2 != 0) {
          Aig_ManIncrementTravId(p);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vSources->nSize);
  }
  if (pnFlow != (int *)0x0) {
    *pnFlow = iVar3;
  }
  Aig_ManIncrementTravId(p);
  if (0 < vSources->nSize) {
    lVar5 = 0;
    do {
      pvVar1 = vSources->pArray[lVar5];
      if ((*(uint *)((long)pvVar1 + 0x18) & 0x30) != 0x20) {
        __assert_fail("!pObj->fMarkA && pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x31c,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
      }
      pAVar4 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe);
      if (((pAVar4->field_0x18 & 0x20) == 0) &&
         (iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar4), iVar2 != 0)) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,800,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
      }
      if (((0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7) &&
          (pAVar4 = (Aig_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),
          (pAVar4->field_0x18 & 0x20) == 0)) &&
         (iVar2 = Llb_ManFlowBwdPath2_rec(p,pAVar4), iVar2 != 0)) {
        __assert_fail("RetValue == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                      ,0x325,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < vSources->nSize);
  }
  vMinCut = Llb_ManFlowMinCut(p);
  if (vMinCut->nSize != iVar3) {
    __assert_fail("Vec_PtrSize(vMinCut) == Flow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb2Flow.c"
                  ,0x32b,"Vec_Ptr_t *Llb_ManFlow(Aig_Man_t *, Vec_Ptr_t *, int *)");
  }
  iVar3 = Llb_ManFlowVerifyCut(p,vMinCut);
  if (iVar3 == 0) {
    puts("Llb_ManFlow() error! The computed min-cut is not a cut!");
  }
  return vMinCut;
}

Assistant:

Vec_Ptr_t * Llb_ManFlow( Aig_Man_t * p, Vec_Ptr_t * vSources, int * pnFlow )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int Flow, FlowCur, RetValue, i;
    // find the max-flow
    Flow = 0;
    Aig_ManCleanData( p );
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSources, pObj, i )
    {
        assert( !pObj->fMarkA && pObj->fMarkB );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            FlowCur  = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            Flow    += FlowCur;
            if ( FlowCur )
                Aig_ManIncrementTravId(p);
        }
    }
    if ( pnFlow )
        *pnFlow = Flow;

    // mark the nodes reachable from the latches
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vSources, pObj, i )
    {
        assert( !pObj->fMarkA && pObj->fMarkB );
        if ( !Aig_ObjFanin0(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin0(pObj) );
            assert( RetValue == 0 );
        }
        if ( Aig_ObjIsNode(pObj) && !Aig_ObjFanin1(pObj)->fMarkB )
        {
            RetValue = Llb_ManFlowBwdPath2_rec( p, Aig_ObjFanin1(pObj) );
            assert( RetValue == 0 );
        }
    }

    // find the min-cut with the smallest volume
    vMinCut = Llb_ManFlowMinCut( p );
    assert( Vec_PtrSize(vMinCut) == Flow );
    // verify the cut
    if ( !Llb_ManFlowVerifyCut(p, vMinCut) )
        printf( "Llb_ManFlow() error! The computed min-cut is not a cut!\n" );
//    Llb_ManFlowPrintCut( p, vMinCut );
    return vMinCut;
}